

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# as-02-wrap.cpp
# Opt level: O2

CommandOptions * write_PCM_file(CommandOptions *Options)

{
  long *plVar1;
  int iVar2;
  undefined8 uVar3;
  FILE *pFVar4;
  int iVar5;
  ui32_t uVar6;
  Rational *this;
  long lVar7;
  char *pcVar8;
  AESEncContext *this_00;
  HMACContext *this_01;
  uint uVar9;
  long in_RSI;
  long *plVar10;
  FortunaRNG RNG;
  undefined4 local_378;
  MXFWriter Writer;
  Result_t result;
  AudioDescriptor ADesc;
  byte_t IV_buf [16];
  char buf [64];
  FrameBuffer FrameBuffer;
  PCMParserList Parser;
  Result_t local_100 [104];
  AudioDescriptor local_98 [2];
  
  ASDCP::PCMParserList::PCMParserList(&Parser);
  AS_02::PCM::MXFWriter::MXFWriter(&Writer);
  ASDCP::PCM::FrameBuffer::FrameBuffer(&FrameBuffer);
  ASDCP::PCMParserList::OpenRead((list *)&result,(Rational *)&Parser);
  if (-1 < _result) {
    ADesc.EditRate.Numerator = 0;
    ADesc.EditRate.Denominator = 0;
    ADesc.AudioSamplingRate.Numerator = 0;
    ADesc.AudioSamplingRate.Denominator = 0;
    ASDCP::PCMParserList::FillAudioDescriptor(local_98);
    Kumu::Result_t::~Result_t((Result_t *)local_98);
    ADesc.EditRate = *(Rational *)(in_RSI + 0x18);
    ASDCP::PCM::CalcFrameBufferSize(&ADesc);
    ASDCP::FrameBuffer::Capacity((uint)local_100);
    Kumu::Result_t::~Result_t(local_100);
    pFVar4 = _stderr;
    if (*(char *)(in_RSI + 5) == '\x01') {
      iVar5 = ADesc.AudioSamplingRate.Numerator;
      iVar2 = ADesc.AudioSamplingRate.Denominator;
      IV_buf[0] = '@';
      IV_buf[1] = '\0';
      IV_buf[2] = '\0';
      IV_buf[3] = '\0';
      RationalToString((Rational *)(in_RSI + 0x18),buf,(ui32_t *)IV_buf);
      uVar6 = ASDCP::PCM::CalcSamplesPerFrame(&ADesc);
      local_378 = SUB84(((double)iVar5 / (double)iVar2) / 1000.0,0);
      fprintf(pFVar4,"%.1fkHz PCM Audio, %s fps (%u spf)\n",local_378,buf,(ulong)uVar6);
      fputs("AudioDescriptor:\n",_stderr);
      ASDCP::PCM::AudioDescriptorDump(&ADesc,(_IO_FILE *)0x0);
    }
    this = (Rational *)operator_new(0x1e8);
    ASDCP::MXF::WaveAudioDescriptor::WaveAudioDescriptor((WaveAudioDescriptor *)this,g_dict);
    ASDCP::PCM_ADesc_to_MD((AudioDescriptor *)buf,(WaveAudioDescriptor *)&ADesc);
    Kumu::Result_t::operator=(&result,(Result_t *)buf);
    Kumu::Result_t::~Result_t((Result_t *)buf);
    plVar1 = (long *)(in_RSI + 0x110);
    if (*(long **)(in_RSI + 0x110) == plVar1) {
      *(undefined1 *)&this[0x39].Numerator = *(undefined1 *)(in_RSI + 0x78);
      uVar3 = *(undefined8 *)(in_RSI + 0x81);
      *(undefined8 *)((long)&this[0x39].Numerator + 1) = *(undefined8 *)(in_RSI + 0x79);
      *(undefined8 *)((long)&this[0x3a].Numerator + 1) = uVar3;
      *(undefined1 *)&this[0x3c].Numerator = 1;
    }
    else {
      iVar5 = ASDCP::MXF::ASDCP_MCAConfigParser::ChannelCount();
      pFVar4 = _stderr;
      if (iVar5 != this[0x2d].Numerator) {
        uVar9 = ASDCP::MXF::ASDCP_MCAConfigParser::ChannelCount();
        fprintf(pFVar4,"MCA label count (%d) differs from essence stream channel count (%d).\n",
                (ulong)uVar9,(ulong)(uint)this[0x2d].Numerator);
        Kumu::Result_t::Result_t((Result_t *)Options,(Result_t *)&Kumu::RESULT_FAIL);
        goto LAB_0010d197;
      }
      plVar10 = plVar1;
      while (plVar10 = (long *)*plVar10, plVar10 != plVar1) {
        if ((plVar10[2] != 0) &&
           (lVar7 = __dynamic_cast(plVar10[2],&ASDCP::MXF::InterchangeObject::typeinfo,
                                   &ASDCP::MXF::SoundfieldGroupLabelSubDescriptor::typeinfo,0),
           lVar7 != 0)) {
          if (*(long *)(in_RSI + 0x2d0) != 0) {
            ASDCP::MXF::UTF16String::UTF16String((UTF16String *)buf,(string *)(in_RSI + 0x2c8));
            ASDCP::MXF::optional_property<ASDCP::MXF::UTF16String>::operator=
                      ((optional_property<ASDCP::MXF::UTF16String> *)(lVar7 + 0x290),
                       (UTF16String *)buf);
            std::__cxx11::string::~string((string *)(buf + 8));
          }
          if (*(long *)(in_RSI + 0x2b0) != 0) {
            ASDCP::MXF::UTF16String::UTF16String((UTF16String *)buf,(string *)(in_RSI + 0x2a8));
            ASDCP::MXF::optional_property<ASDCP::MXF::UTF16String>::operator=
                      ((optional_property<ASDCP::MXF::UTF16String> *)(lVar7 + 0x2c0),
                       (UTF16String *)buf);
            std::__cxx11::string::~string((string *)(buf + 8));
          }
        }
      }
      pcVar8 = (char *)ASDCP::Dictionary::Type((MDD_t)g_dict);
      buf._0_8_ = *(undefined8 *)pcVar8;
      buf._8_8_ = *(undefined8 *)(pcVar8 + 8);
      *(undefined1 *)&this[0x39].Numerator = 1;
      *(undefined8 *)((long)&this[0x39].Numerator + 1) = buf._0_8_;
      *(undefined8 *)((long)&this[0x3a].Numerator + 1) = buf._8_8_;
      *(undefined1 *)&this[0x3c].Numerator = 1;
    }
    if (-1 < _result) {
      if (*(char *)(in_RSI + 0xc) == '\0') {
        ASDCP::WriterInfo::WriterInfo((WriterInfo *)buf,&s_MyInfo.super_WriterInfo);
        if (*(char *)(in_RSI + 2) == '\x01') {
          buf._16_8_ = *(undefined8 *)(in_RSI + 0x45);
          buf._24_8_ = *(undefined8 *)(in_RSI + 0x4d);
        }
        else {
          Kumu::GenRandomUUID((uchar *)(buf + 0x10));
        }
        if (*(char *)(in_RSI + 1) == '\x01') {
          Kumu::FortunaRNG::FortunaRNG(&RNG);
          Kumu::GenRandomUUID((uchar *)(buf + 0x20));
          if (*(char *)(in_RSI + 0x34) == '\x01') {
            buf._48_8_ = *(undefined8 *)(in_RSI + 0x35);
            buf._56_8_ = *(undefined8 *)(in_RSI + 0x3d);
          }
          else {
            create_random_uuid((byte_t *)(buf + 0x30));
          }
          this_00 = (AESEncContext *)operator_new(8);
          ASDCP::AESEncContext::AESEncContext(this_00);
          ASDCP::AESEncContext::InitKey((uchar *)&ADesc);
          Kumu::Result_t::operator=(&result,(Result_t *)&ADesc);
          Kumu::Result_t::~Result_t((Result_t *)&ADesc);
          if (-1 < _result) {
            Kumu::FortunaRNG::FillRandom((uchar *)&RNG,(uint)IV_buf);
            ASDCP::AESEncContext::SetIVec((uchar *)&ADesc);
            Kumu::Result_t::operator=(&result,(Result_t *)&ADesc);
            Kumu::Result_t::~Result_t((Result_t *)&ADesc);
            if ((-1 < _result) && (*(char *)(in_RSI + 4) == '\x01')) {
              this_01 = (HMACContext *)operator_new(8);
              ASDCP::HMACContext::HMACContext(this_01);
              ASDCP::HMACContext::InitKey((uchar *)&ADesc,(LabelSet_t)this_01);
              Kumu::Result_t::operator=(&result,(Result_t *)&ADesc);
              Kumu::Result_t::~Result_t((Result_t *)&ADesc);
            }
          }
          Kumu::FortunaRNG::~FortunaRNG(&RNG);
        }
        if (-1 < _result) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)IV_buf,*(char **)(in_RSI + 0x268),(allocator<char> *)&RNG);
          AS_02::PCM::MXFWriter::OpenWrite
                    ((string *)&ADesc,(WriterInfo *)&Writer,(FileDescriptor *)IV_buf,(list *)buf,
                     this,(uint)plVar1);
          Kumu::Result_t::operator=(&result,(Result_t *)&ADesc);
          Kumu::Result_t::~Result_t((Result_t *)&ADesc);
          std::__cxx11::string::~string((string *)IV_buf);
        }
        ASDCP::WriterInfo::~WriterInfo((WriterInfo *)buf);
        if (_result < 0) goto LAB_0010d185;
      }
      ASDCP::PCMParserList::Reset();
      Kumu::Result_t::operator=(&result,(Result_t *)buf);
      Kumu::Result_t::~Result_t((Result_t *)buf);
      for (uVar9 = 0; (-1 < _result && (uVar9 < *(uint *)(in_RSI + 0x10))); uVar9 = uVar9 + 1) {
        ASDCP::PCMParserList::ReadFrame((FrameBuffer *)buf);
        Kumu::Result_t::operator=(&result,(Result_t *)buf);
        Kumu::Result_t::~Result_t((Result_t *)buf);
        if (-1 < _result) {
          if (*(char *)(in_RSI + 5) == '\x01') {
            ASDCP::PCM::FrameBuffer::Dump((_IO_FILE *)&FrameBuffer,(uint)_stderr);
          }
          if (*(char *)(in_RSI + 0xc) != '\x01') {
            AS_02::PCM::MXFWriter::WriteFrame
                      ((FrameBuffer *)buf,(AESEncContext *)&Writer,(HMACContext *)&FrameBuffer);
            Kumu::Result_t::operator=(&result,(Result_t *)buf);
            Kumu::Result_t::~Result_t((Result_t *)buf);
          }
        }
      }
      if (_result == Kumu::RESULT_ENDOFFILE) {
        Kumu::Result_t::operator=(&result,(Result_t *)Kumu::RESULT_OK);
      }
      if ((-1 < _result) && (*(char *)(in_RSI + 0xc) == '\0')) {
        AS_02::PCM::MXFWriter::Finalize();
        Kumu::Result_t::operator=(&result,(Result_t *)buf);
        Kumu::Result_t::~Result_t((Result_t *)buf);
      }
    }
  }
LAB_0010d185:
  Kumu::Result_t::Result_t((Result_t *)Options,&result);
LAB_0010d197:
  Kumu::Result_t::~Result_t(&result);
  ASDCP::FrameBuffer::~FrameBuffer(&FrameBuffer.super_FrameBuffer);
  AS_02::PCM::MXFWriter::~MXFWriter(&Writer);
  ASDCP::PCMParserList::~PCMParserList(&Parser);
  return Options;
}

Assistant:

Result_t
write_PCM_file(CommandOptions& Options)
{
  AESEncContext*    Context = 0;
  HMACContext*      HMAC = 0;
  PCMParserList     Parser;
  AS_02::PCM::MXFWriter    Writer;
  PCM::FrameBuffer  FrameBuffer;
  ASDCP::MXF::WaveAudioDescriptor *essence_descriptor = 0;

  // set up essence parser
  Result_t result = Parser.OpenRead(Options.filenames, Options.edit_rate);

  // set up MXF writer
  if ( ASDCP_SUCCESS(result) )
    {
      ASDCP::PCM::AudioDescriptor ADesc;
      Parser.FillAudioDescriptor(ADesc);

      ADesc.EditRate = Options.edit_rate;
      FrameBuffer.Capacity(PCM::CalcFrameBufferSize(ADesc));

      if ( Options.verbose_flag )
	{
	  char buf[64];
	  fprintf(stderr, "%.1fkHz PCM Audio, %s fps (%u spf)\n",
		  ADesc.AudioSamplingRate.Quotient() / 1000.0,
		  RationalToString(Options.edit_rate, buf, 64),
		  PCM::CalcSamplesPerFrame(ADesc));
	  fputs("AudioDescriptor:\n", stderr);
	  PCM::AudioDescriptorDump(ADesc);
	}

      essence_descriptor = new ASDCP::MXF::WaveAudioDescriptor(g_dict);

      result = ASDCP::PCM_ADesc_to_MD(ADesc, essence_descriptor);

      if ( Options.mca_config.empty() )
	{
	  essence_descriptor->ChannelAssignment = Options.channel_assignment;
	}
      else
	{
	  if ( Options.mca_config.ChannelCount() != essence_descriptor->ChannelCount )
	    {
	      fprintf(stderr, "MCA label count (%d) differs from essence stream channel count (%d).\n",
		      Options.mca_config.ChannelCount(), essence_descriptor->ChannelCount);
	      return RESULT_FAIL;
	    }

	  // This marks all soundfield groups using the same MCA property values
	  MXF::InterchangeObject_list_t::iterator i;
	  for ( i = Options.mca_config.begin(); i != Options.mca_config.end(); ++i )
	    {
	      MXF::SoundfieldGroupLabelSubDescriptor * desc = dynamic_cast<MXF::SoundfieldGroupLabelSubDescriptor*>(*i);
	      if ( desc != 0 )
		{
		  if ( ! Options.mca_audio_content_kind.empty() )
		    {
		      desc->MCAAudioContentKind = Options.mca_audio_content_kind;
		    }
		  if ( ! Options.mca_audio_element_kind.empty() )
		    {
		      desc->MCAAudioElementKind = Options.mca_audio_element_kind;
		    }
		}
	    }

	  essence_descriptor->ChannelAssignment = g_dict->ul(MDD_IMFAudioChannelCfg_MCA);
	}
    }

  if ( ASDCP_SUCCESS(result) && ! Options.no_write_flag )
    {
      WriterInfo Info = s_MyInfo;  // fill in your favorite identifiers here
      Info.LabelSetType = LS_MXF_SMPTE;

      if ( Options.asset_id_flag )
	memcpy(Info.AssetUUID, Options.asset_id_value, UUIDlen);
      else
	Kumu::GenRandomUUID(Info.AssetUUID);

#ifdef HAVE_OPENSSL
      // configure encryption
      if( Options.key_flag )
	{
      byte_t            IV_buf[CBC_BLOCK_SIZE];
      Kumu::FortunaRNG  RNG;
	  Kumu::GenRandomUUID(Info.ContextID);
	  Info.EncryptedEssence = true;

	  if ( Options.key_id_flag )
	    {
	      memcpy(Info.CryptographicKeyID, Options.key_id_value, UUIDlen);
	    }
	  else
	    {
	      create_random_uuid(Info.CryptographicKeyID);
	    }

	  Context = new AESEncContext;
	  result = Context->InitKey(Options.key_value);

	  if ( ASDCP_SUCCESS(result) )
	    result = Context->SetIVec(RNG.FillRandom(IV_buf, CBC_BLOCK_SIZE));

	  if ( ASDCP_SUCCESS(result) && Options.write_hmac )
	    {
	      Info.UsesHMAC = true;
	      HMAC = new HMACContext;
	      result = HMAC->InitKey(Options.key_value, Info.LabelSetType);
	    }
	}
#endif // HAVE_OPENSSL

      if ( ASDCP_SUCCESS(result) )
	{
	  result = Writer.OpenWrite(Options.out_file.c_str(), Info, essence_descriptor,
				    Options.mca_config, Options.edit_rate);
	}
    }

  if ( ASDCP_SUCCESS(result) )
    {
      result = Parser.Reset();
      ui32_t duration = 0;

      while ( ASDCP_SUCCESS(result) && duration++ < Options.duration )
	{
	  result = Parser.ReadFrame(FrameBuffer);

	  if ( ASDCP_SUCCESS(result) )
	    {
	      if ( Options.verbose_flag )
		FrameBuffer.Dump(stderr, Options.fb_dump_size);

	      if ( ! Options.no_write_flag )
		{
		  result = Writer.WriteFrame(FrameBuffer, Context, HMAC);

		  // The Writer class will forward the last block of ciphertext
		  // to the encryption context for use as the IV for the next
		  // frame. If you want to use non-sequitur IV values, un-comment
		  // the following  line of code.
		  // if ( ASDCP_SUCCESS(result) && Options.key_flag )
		  //   Context->SetIVec(RNG.FillRandom(IV_buf, CBC_BLOCK_SIZE));
		}
	    }
	}

      if ( result == RESULT_ENDOFFILE )
	result = RESULT_OK;
    }

  if ( ASDCP_SUCCESS(result) && ! Options.no_write_flag )
    result = Writer.Finalize();

  return result;
}